

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_fwd_txfm_avx2.c
# Opt level: O1

void av1_fwd_txfm2d_32x32_avx2(int16_t *input,int32_t *output,int stride,TX_TYPE tx_type,int bd)

{
  byte bVar1;
  transform_1d_avx2_conflict2 p_Var2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  int8_t iVar6;
  int iVar7;
  long lVar8;
  uint uVar9;
  undefined7 in_register_00000009;
  int16_t *piVar10;
  long lVar11;
  __m256i *palVar12;
  undefined1 *puVar13;
  ulong uVar14;
  longlong *plVar15;
  longlong *plVar16;
  __m256i *out;
  bool bVar17;
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  __m256i buf1 [128];
  __m256i buf0 [128];
  undefined1 local_20a0 [14];
  int8_t local_2092;
  int8_t local_2091;
  int16_t *local_2090;
  transform_1d_avx2_conflict2 local_2088;
  byte *local_2080;
  int32_t *local_2078;
  __m256i *local_2070;
  long local_2068;
  longlong local_2060 [2];
  longlong alStack_2050 [510];
  longlong local_1060 [4];
  longlong local_1040 [514];
  
  puVar13 = local_20a0;
  local_2091 = '\f';
  local_2092 = '\f';
  p_Var2 = col_txfm8x32_arr[CONCAT71(in_register_00000009,tx_type) & 0xffffffff];
  plVar15 = local_1060;
  plVar16 = local_1040;
  lVar8 = 0;
  local_2080 = (byte *)av1_fwd_txfm_shift_ls[3];
  local_2088 = p_Var2;
  local_2078 = output;
  do {
    iVar6 = local_2091;
    lVar11 = 0;
    piVar10 = input;
    do {
      uVar3 = *(undefined8 *)(piVar10 + 4);
      uVar4 = *(undefined8 *)(piVar10 + 8);
      uVar5 = *(undefined8 *)(piVar10 + 0xc);
      *(undefined8 *)((long)local_2060 + lVar11) = *(undefined8 *)piVar10;
      *(undefined8 *)((long)local_2060 + lVar11 + 8) = uVar3;
      *(undefined8 *)((long)alStack_2050 + lVar11) = uVar4;
      *(undefined8 *)((long)alStack_2050 + lVar11 + 8) = uVar5;
      lVar11 = lVar11 + 0x20;
      piVar10 = piVar10 + stride;
    } while (lVar11 != 0x400);
    lVar11 = 0;
    do {
      auVar18 = vpmovsxwd_avx2(*(undefined1 (*) [16])((long)local_2060 + lVar11));
      auVar19 = vpmovsxwd_avx2(*(undefined1 (*) [16])((long)alStack_2050 + lVar11));
      *(undefined1 (*) [32])((long)plVar16 + lVar11 * 4 + -0x20) = auVar18;
      *(undefined1 (*) [32])((long)plVar16 + lVar11 * 4) = auVar19;
      lVar11 = lVar11 + 0x20;
    } while (lVar11 != 0x400);
    bVar1 = *local_2080;
    uVar9 = (uint)(char)bVar1;
    if ((int)uVar9 < 0) {
      iVar7 = 1 << (~bVar1 & 0x1f);
      auVar18._4_4_ = iVar7;
      auVar18._0_4_ = iVar7;
      auVar18._8_4_ = iVar7;
      auVar18._12_4_ = iVar7;
      auVar18._16_4_ = iVar7;
      auVar18._20_4_ = iVar7;
      auVar18._24_4_ = iVar7;
      auVar18._28_4_ = iVar7;
      lVar11 = 0;
      do {
        auVar19 = vpaddd_avx2(auVar18,*(undefined1 (*) [32])((long)plVar15 + lVar11));
        auVar19 = vpsrad_avx2(auVar19,ZEXT416(-uVar9));
        *(undefined1 (*) [32])((long)plVar15 + lVar11) = auVar19;
        lVar11 = lVar11 + 0x80;
      } while (lVar11 != 0x1000);
    }
    else if (bVar1 != 0) {
      lVar11 = 0;
      do {
        auVar18 = vpslld_avx2(*(undefined1 (*) [32])((long)plVar15 + lVar11),ZEXT416(uVar9));
        *(undefined1 (*) [32])((long)plVar15 + lVar11) = auVar18;
        lVar11 = lVar11 + 0x80;
      } while (lVar11 != 0x1000);
    }
    bVar1 = *local_2080;
    uVar9 = (uint)(char)bVar1;
    if ((int)uVar9 < 0) {
      iVar7 = 1 << (~bVar1 & 0x1f);
      auVar19._4_4_ = iVar7;
      auVar19._0_4_ = iVar7;
      auVar19._8_4_ = iVar7;
      auVar19._12_4_ = iVar7;
      auVar19._16_4_ = iVar7;
      auVar19._20_4_ = iVar7;
      auVar19._24_4_ = iVar7;
      auVar19._28_4_ = iVar7;
      lVar11 = 0;
      do {
        auVar18 = vpaddd_avx2(auVar19,*(undefined1 (*) [32])((long)plVar16 + lVar11));
        auVar18 = vpsrad_avx2(auVar18,ZEXT416(-uVar9));
        *(undefined1 (*) [32])((long)plVar16 + lVar11) = auVar18;
        lVar11 = lVar11 + 0x80;
      } while (lVar11 != 0x1000);
    }
    else if (bVar1 != 0) {
      lVar11 = 0;
      do {
        auVar18 = vpslld_avx2(*(undefined1 (*) [32])((long)plVar16 + lVar11),ZEXT416(uVar9));
        *(undefined1 (*) [32])((long)plVar16 + lVar11) = auVar18;
        lVar11 = lVar11 + 0x80;
      } while (lVar11 != 0x1000);
    }
    local_2070 = (__m256i *)(local_1040 + lVar8 * 8);
    local_2090 = input;
    local_2068 = lVar8;
    (*p_Var2)((__m256i *)(local_1060 + lVar8 * 8),(__m256i *)(local_1060 + lVar8 * 8),local_2091,4,4
             );
    (*p_Var2)(local_2070,local_2070,iVar6,4,4);
    bVar1 = local_2080[1];
    if ((char)bVar1 < '\0') {
      iVar7 = 1 << (~bVar1 & 0x1f);
      auVar20._4_4_ = iVar7;
      auVar20._0_4_ = iVar7;
      auVar20._8_4_ = iVar7;
      auVar20._12_4_ = iVar7;
      auVar20._16_4_ = iVar7;
      auVar20._20_4_ = iVar7;
      auVar20._24_4_ = iVar7;
      auVar20._28_4_ = iVar7;
      lVar8 = 0;
      do {
        auVar18 = vpaddd_avx2(auVar20,*(undefined1 (*) [32])((long)plVar15 + lVar8));
        auVar18 = vpsrad_avx2(auVar18,ZEXT416((uint)-(int)(char)bVar1));
        *(undefined1 (*) [32])((long)plVar15 + lVar8) = auVar18;
        lVar8 = lVar8 + 0x80;
      } while (lVar8 != 0x1000);
    }
    else if (bVar1 != 0) {
      lVar8 = 0;
      do {
        auVar18 = vpslld_avx2(*(undefined1 (*) [32])((long)plVar15 + lVar8),
                              ZEXT416((uint)(int)(char)bVar1));
        *(undefined1 (*) [32])((long)plVar15 + lVar8) = auVar18;
        lVar8 = lVar8 + 0x80;
      } while (lVar8 != 0x1000);
    }
    bVar1 = local_2080[1];
    if ((char)bVar1 < '\0') {
      iVar7 = 1 << (~bVar1 & 0x1f);
      auVar21._4_4_ = iVar7;
      auVar21._0_4_ = iVar7;
      auVar21._8_4_ = iVar7;
      auVar21._12_4_ = iVar7;
      auVar21._16_4_ = iVar7;
      auVar21._20_4_ = iVar7;
      auVar21._24_4_ = iVar7;
      auVar21._28_4_ = iVar7;
      lVar8 = 0;
      do {
        auVar18 = vpaddd_avx2(auVar21,*(undefined1 (*) [32])((long)plVar16 + lVar8));
        auVar18 = vpsrad_avx2(auVar18,ZEXT416((uint)-(int)(char)bVar1));
        *(undefined1 (*) [32])((long)plVar16 + lVar8) = auVar18;
        lVar8 = lVar8 + 0x80;
      } while (lVar8 != 0x1000);
    }
    else if (bVar1 != 0) {
      lVar8 = 0;
      do {
        auVar18 = vpslld_avx2(*(undefined1 (*) [32])((long)plVar16 + lVar8),
                              ZEXT416((uint)(int)(char)bVar1));
        *(undefined1 (*) [32])((long)plVar16 + lVar8) = auVar18;
        lVar8 = lVar8 + 0x80;
      } while (lVar8 != 0x1000);
    }
    lVar8 = local_2068 + 1;
    input = local_2090 + 0x10;
    plVar16 = plVar16 + 8;
    plVar15 = plVar15 + 8;
  } while (local_2068 == 0);
  palVar12 = (__m256i *)local_2060;
  plVar15 = local_1060;
  uVar14 = 0;
  do {
    lVar8 = 0;
    out = palVar12;
    do {
      fwd_txfm_transpose_8x8_avx2((__m256i *)((long)plVar15 + lVar8),out,4,4);
      p_Var2 = local_2088;
      iVar6 = local_2092;
      out = out + 0x20;
      lVar8 = lVar8 + 0x20;
    } while (lVar8 != 0x80);
    palVar12 = palVar12 + 1;
    plVar15 = plVar15 + 0x80;
    bVar17 = uVar14 < 0x18;
    uVar14 = uVar14 + 8;
  } while (bVar17);
  lVar8 = 0;
  do {
    puVar13 = puVar13 + 0x40;
    (*p_Var2)((__m256i *)(local_2060 + lVar8 * 8),(__m256i *)(local_2060 + lVar8 * 8),iVar6,4,4);
    (*p_Var2)((__m256i *)(alStack_2050 + lVar8 * 8 + 2),(__m256i *)(alStack_2050 + lVar8 * 8 + 2),
              iVar6,4,4);
    bVar1 = local_2080[2];
    if ((char)bVar1 < '\0') {
      iVar7 = 1 << (~bVar1 & 0x1f);
      auVar22._4_4_ = iVar7;
      auVar22._0_4_ = iVar7;
      auVar22._8_4_ = iVar7;
      auVar22._12_4_ = iVar7;
      auVar22._16_4_ = iVar7;
      auVar22._20_4_ = iVar7;
      auVar22._24_4_ = iVar7;
      auVar22._28_4_ = iVar7;
      lVar11 = 0;
      do {
        auVar18 = vpaddd_avx2(auVar22,*(undefined1 (*) [32])(puVar13 + lVar11));
        auVar18 = vpsrad_avx2(auVar18,ZEXT416((uint)-(int)(char)bVar1));
        *(undefined1 (*) [32])(puVar13 + lVar11) = auVar18;
        lVar11 = lVar11 + 0x80;
      } while (lVar11 != 0x1000);
    }
    else if (bVar1 != 0) {
      lVar11 = 0;
      do {
        auVar18 = vpslld_avx2(*(undefined1 (*) [32])(puVar13 + lVar11),
                              ZEXT416((uint)(int)(char)bVar1));
        *(undefined1 (*) [32])(puVar13 + lVar11) = auVar18;
        lVar11 = lVar11 + 0x80;
      } while (lVar11 != 0x1000);
    }
    bVar1 = local_2080[2];
    if ((char)bVar1 < '\0') {
      iVar7 = 1 << (~bVar1 & 0x1f);
      auVar23._4_4_ = iVar7;
      auVar23._0_4_ = iVar7;
      auVar23._8_4_ = iVar7;
      auVar23._12_4_ = iVar7;
      auVar23._16_4_ = iVar7;
      auVar23._20_4_ = iVar7;
      auVar23._24_4_ = iVar7;
      auVar23._28_4_ = iVar7;
      lVar11 = 0x20;
      do {
        auVar18 = vpaddd_avx2(auVar23,*(undefined1 (*) [32])(puVar13 + lVar11));
        auVar18 = vpsrad_avx2(auVar18,ZEXT416((uint)-(int)(char)bVar1));
        *(undefined1 (*) [32])(puVar13 + lVar11) = auVar18;
        lVar11 = lVar11 + 0x80;
      } while (lVar11 != 0x1020);
    }
    else if (bVar1 != 0) {
      lVar11 = 0x20;
      do {
        auVar18 = vpslld_avx2(*(undefined1 (*) [32])(puVar13 + lVar11),
                              ZEXT416((uint)(int)(char)bVar1));
        *(undefined1 (*) [32])(puVar13 + lVar11) = auVar18;
        lVar11 = lVar11 + 0x80;
      } while (lVar11 != 0x1020);
    }
    bVar17 = lVar8 == 0;
    lVar8 = lVar8 + 1;
  } while (bVar17);
  memcpy(local_2078,local_2060,0x1000);
  return;
}

Assistant:

void av1_fwd_txfm2d_32x32_avx2(const int16_t *input, int32_t *output,
                               int stride, TX_TYPE tx_type, int bd) {
  (void)bd;
  __m256i buf0[128], buf1[128];
  const int tx_size = TX_32X32;
  const int8_t *shift = av1_fwd_txfm_shift_ls[tx_size];
  const int txw_idx = get_txw_idx(tx_size);
  const int txh_idx = get_txh_idx(tx_size);
  const int cos_bit_col = av1_fwd_cos_bit_col[txw_idx][txh_idx];
  const int cos_bit_row = av1_fwd_cos_bit_row[txw_idx][txh_idx];
  const int width = tx_size_wide[tx_size];
  const int height = tx_size_high[tx_size];
  const transform_1d_avx2 col_txfm = col_txfm8x32_arr[tx_type];
  const transform_1d_avx2 row_txfm = row_txfm8x32_arr[tx_type];
  int r, c;
  const int width_div16 = (width >> 4);
  const int width_div8 = (width >> 3);

  for (int i = 0; i < width_div16; i++) {
    load_buffer_16xn_avx2(input + (i << 4), &buf0[(i << 1)], stride, height,
                          width_div8, 0, 0);
    round_shift_32_8xn_avx2(&buf0[(i << 1)], height, shift[0], width_div8);
    round_shift_32_8xn_avx2(&buf0[(i << 1) + 1], height, shift[0], width_div8);
    col_txfm(&buf0[(i << 1)], &buf0[(i << 1)], cos_bit_col, width_div8,
             width_div8);
    col_txfm(&buf0[(i << 1) + 1], &buf0[(i << 1) + 1], cos_bit_col, width_div8,
             width_div8);
    round_shift_32_8xn_avx2(&buf0[(i << 1)], height, shift[1], width_div8);
    round_shift_32_8xn_avx2(&buf0[(i << 1) + 1], height, shift[1], width_div8);
  }

  for (r = 0; r < height; r += 8) {
    for (c = 0; c < width_div8; c++) {
      fwd_txfm_transpose_8x8_avx2(&buf0[r * width_div8 + c],
                                  &buf1[c * 8 * width_div8 + (r >> 3)],
                                  width_div8, width_div8);
    }
  }

  for (int i = 0; i < width_div16; i++) {
    row_txfm(&buf1[(i << 1)], &buf1[(i << 1)], cos_bit_row, width_div8,
             width_div8);
    row_txfm(&buf1[(i << 1) + 1], &buf1[(i << 1) + 1], cos_bit_row, width_div8,
             width_div8);
    round_shift_32_8xn_avx2(&buf1[(i << 1)], height, shift[2], width_div8);
    round_shift_32_8xn_avx2(&buf1[(i << 1) + 1], height, shift[2], width_div8);
  }

  store_buffer_avx2(buf1, output, 8, 128);
}